

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::ParsedScene(ParsedScene *this)

{
  FileLoc loc;
  _func_int **pp_Var1;
  SceneRepresentation *in_RDI;
  ParameterDictionary dict;
  value_type *__x;
  Transform *in_stack_fffffffffffffc00;
  SceneEntity *this_00;
  ParameterDictionary *in_stack_fffffffffffffc08;
  CameraSceneEntity *in_stack_fffffffffffffc10;
  polymorphic_allocator<pbrt::ParsedParameter_*> *alloc;
  TransformCache *in_stack_fffffffffffffc20;
  RGBColorSpace *colorSpace;
  ParsedParameterVector *p;
  SceneEntity *this_01;
  SceneRepresentation *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  SceneRepresentation *pSVar2;
  GraphicsState *this_03;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_308;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_300 [2];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined1 local_1a9 [193];
  undefined1 local_e8 [232];
  
  SceneRepresentation::SceneRepresentation(in_RDI);
  in_RDI->_vptr_SceneRepresentation = (_func_int **)&PTR_Scale_0374a438;
  SceneEntity::SceneEntity(&in_stack_fffffffffffffc10->super_SceneEntity);
  SceneEntity::SceneEntity(&in_stack_fffffffffffffc10->super_SceneEntity);
  SceneEntity::SceneEntity(&in_stack_fffffffffffffc10->super_SceneEntity);
  SceneEntity::SceneEntity(&in_stack_fffffffffffffc10->super_SceneEntity);
  SceneEntity::SceneEntity(&in_stack_fffffffffffffc10->super_SceneEntity);
  CameraSceneEntity::CameraSceneEntity(in_stack_fffffffffffffc10);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
            *)0x9ca688);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::vector
            ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)0x9ca6a1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
         *)0x9ca6bd);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
            *)0x9ca6d9);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
            *)0x9ca6f5);
  std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::vector
            ((vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *)0x9ca711);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::vector
            ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)0x9ca72d);
  std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::vector
            ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)0x9ca749);
  std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>::
  vector((vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_> *)
         0x9ca765);
  this_03 = (GraphicsState *)&in_RDI[0x81].errorExit;
  std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::vector
            ((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
             0x9ca781);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
         *)0x9ca79d);
  *(undefined4 *)&in_RDI[0x86]._vptr_SceneRepresentation = 0;
  TransformSet::TransformSet((TransformSet *)in_stack_fffffffffffffc10);
  *(undefined4 *)((long)&in_RDI[0x96]._vptr_SceneRepresentation + 4) = 3;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
         *)0x9ca7e0);
  TransformCache::TransformCache(in_stack_fffffffffffffc20);
  *(undefined4 *)&in_RDI[0xa3].errorExit = 0;
  *(undefined4 *)&in_RDI[0xa3].field_0xc = 0x3f800000;
  pbrt::Transform::Transform(in_stack_fffffffffffffc00);
  this_01 = (SceneEntity *)&in_RDI[0xac].errorExit;
  std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>::
  vector((vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
          *)0x9ca83e);
  __s = in_RDI + 0xae;
  std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::vector
            ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)0x9ca857);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI[0xaf].errorExit;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9ca870);
  pSVar2 = in_RDI + 0xb1;
  std::vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
  vector((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_> *
         )0x9ca889);
  *(undefined8 *)&in_RDI[0xb2].errorExit = 0;
  pp_Var1 = (_func_int **)operator_new(0x2f8);
  GraphicsState::GraphicsState(this_03);
  in_RDI[0xac]._vptr_SceneRepresentation = pp_Var1;
  p = (ParsedParameterVector *)local_e8;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffc00);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)(local_e8 + 8),&p->alloc);
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)this_01,p,(RGBColorSpace *)in_stack_fffffffffffffc20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)in_stack_fffffffffffffc00);
  colorSpace = (RGBColorSpace *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,(allocator<char> *)this_01)
  ;
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  local_238 = (undefined1  [16])0x0;
  local_228 = 0;
  FileLoc::FileLoc((FileLoc *)in_stack_fffffffffffffc00);
  loc.filename._M_str = (char *)pSVar2;
  loc.filename._M_len = (size_t)this_02;
  loc._16_8_ = pp_Var1;
  __x = (value_type *)local_238._0_8_;
  this_00 = (SceneEntity *)local_238._8_8_;
  SceneEntity::SceneEntity(this_01,(string *)p,(ParameterDictionary *)colorSpace,loc);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::push_back
            ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)this_00,__x);
  SceneEntity::~SceneEntity(this_00);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9caa07);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x29),"bvh");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x33),"perspective");
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb),"pmj02bn");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1f),"gaussian");
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"rgb");
  alloc = &local_308;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)this_00);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(local_300,alloc);
  ParameterDictionary::ParameterDictionary((ParameterDictionary *)this_01,p,colorSpace);
  ParameterDictionary::operator=((ParameterDictionary *)this_00,(ParameterDictionary *)__x);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9cab1e);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)this_00);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x15),"volpath");
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9cab55);
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Allocate _graphicsState_
    graphicsState = new GraphicsState;

    // Set scene defaults
    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));

    accelerator.name = "bvh";

    camera.name = "perspective";

    sampler.name = "pmj02bn";

    filter.name = "gaussian";

    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);

    integrator.name = "volpath";
}